

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::UListLeaf::~UListLeaf
          (UListLeaf *this)

{
  List<Inferences::ALASCA::SuperpositionConf::Lhs> *pLVar1;
  Term *this_00;
  void **head;
  LDList *pLVar2;
  
  (this->super_Leaf).super_Node._vptr_Node = (_func_int **)&PTR__UListLeaf_00b5aa08;
  pLVar2 = this->_children;
  if (this->_children != (LDList *)0x0) {
    do {
      pLVar1 = pLVar2->_tail;
      if (pLVar2 != (LDList *)0x0) {
        *(undefined8 *)
         &(pLVar2->_head).super_SelectedEquality._inner._inner.
          super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>_>
          .
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>_>
          .
          super_RawCoproduct<Kernel::SelectedSummand,_Kernel::SelectedIntegerEquality,_Kernel::SelectedUninterpretedEquality>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pLVar2;
      }
      pLVar2 = pLVar1;
    } while (pLVar1 != (List<Inferences::ALASCA::SuperpositionConf::Lhs> *)0x0);
    SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node::~Node((Node *)this);
    return;
  }
  (this->super_Leaf).super_Node._vptr_Node = (_func_int **)&PTR__Node_00b5aab0;
  this_00 = (Term *)(this->super_Leaf).super_Node._term._content;
  if (((ulong)this_00 & 3) == 0) {
    Kernel::Term::destroyNonShared(this_00);
  }
  return;
}

Assistant:

~UListLeaf()
  {
    LDList::destroy(_children);
  }